

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O1

void read_level(level_t *record,int field_count,char **field_names,char **field_values)

{
  int iVar1;
  char *pcVar2;
  level_t *__dest;
  ulong uVar3;
  double dVar4;
  
  record->id[0] = '\0';
  record->name[0] = '\0';
  record->index = 0.0;
  if (0 < field_count) {
    uVar3 = 0;
    do {
      pcVar2 = field_names[uVar3];
      iVar1 = strcmp(pcVar2,"level_id");
      if (iVar1 == 0) {
        pcVar2 = field_values[uVar3];
        __dest = record;
LAB_0011a372:
        strcpy(__dest->id,pcVar2);
      }
      else {
        iVar1 = strcmp(pcVar2,"level_index");
        if (iVar1 == 0) {
          dVar4 = strtod(field_values[uVar3],(char **)0x0);
          record->index = dVar4;
        }
        else {
          iVar1 = strcmp(pcVar2,"level_name");
          if (iVar1 == 0) {
            pcVar2 = field_values[uVar3];
            __dest = (level_t *)record->name;
            goto LAB_0011a372;
          }
        }
      }
      uVar3 = uVar3 + 1;
    } while ((uint)field_count != uVar3);
  }
  return;
}

Assistant:

void read_level(level_t *record, int field_count, const char **field_names, const char **field_values) {
    init_level(record);

    for (int i = 0; i < field_count; i++) {
        if (strcmp(field_names[i], "level_id") == 0) {
            strcpy(record->id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "level_index") == 0) {
            record->index = strtod(field_values[i], NULL);
            continue;
        }
        if (strcmp(field_names[i], "level_name") == 0) {
            strcpy(record->name, field_values[i]);
            continue;
        }
    }
}